

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O2

void getUnixString(char *to,int size,object *from)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = (uint)from->header >> 2;
  if (size <= (int)uVar2) {
    error_impl("getUnixString",0x256,"getUnixString(): String too long, %d, for buffer, %d bytes!",
               (ulong)uVar2,(ulong)(uint)size);
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    to[uVar1] = *(char *)((long)&from[1].header + uVar1);
  }
  to[uVar2] = '\0';
  return;
}

Assistant:

void getUnixString(char * to, int size, struct object * from)
{
    int i;
    int fsize = SIZE(from);
    struct byteObject * bobj = (struct byteObject *) from;

    if (fsize >= size) {
        error("getUnixString(): String too long, %d, for buffer, %d bytes!", fsize, size);
    }

    for (i = 0; i < fsize; i++) {
        to[i] = (char)bobj->bytes[i];
    }

    to[i] = '\0';	/* put null terminator at end */
}